

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall kj::Vector<kj::AncillaryMessage>::~Vector(Vector<kj::AncillaryMessage> *this)

{
  AncillaryMessage *pAVar1;
  RemoveConst<kj::AncillaryMessage> *pRVar2;
  AncillaryMessage *pAVar3;
  ArrayDisposer *pAVar4;
  
  pAVar1 = (this->builder).ptr;
  if (pAVar1 != (AncillaryMessage *)0x0) {
    pRVar2 = (this->builder).pos;
    pAVar3 = (this->builder).endPtr;
    (this->builder).ptr = (AncillaryMessage *)0x0;
    (this->builder).pos = (RemoveConst<kj::AncillaryMessage> *)0x0;
    (this->builder).endPtr = (AncillaryMessage *)0x0;
    pAVar4 = (this->builder).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pAVar1,0x18,((long)pRVar2 - (long)pAVar1 >> 3) * -0x5555555555555555,
               ((long)pAVar3 - (long)pAVar1 >> 3) * -0x5555555555555555,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }